

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_ping.cpp
# Opt level: O2

bool __thiscall dev_ping::Impl::host_resolve(Impl *this,string *hostname)

{
  bool bVar1;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = getsockaddr(this,(hostname->_M_dataplus)._M_p,&this->m_dest_addr);
  if (bVar1) {
    std::operator+(&local_40,"Ping: hostname \'",hostname);
    std::operator+(&local_60,&local_40,"\' (to ip: ");
    __rhs = inet_ntoa((in_addr)(this->m_dest_addr).sin_addr.s_addr);
    std::operator+(&local_80,&local_60,__rhs);
    std::operator+(&local_a0,&local_80,")\n");
    std::__cxx11::string::append((string *)&this->status);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    this->host_is_resolve = true;
  }
  else {
    std::operator+(&local_80,"Ping:        Unknow host \'",hostname);
    std::operator+(&local_a0,&local_80,"\' !\n");
    std::__cxx11::string::append((string *)&this->status);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    deinit(this);
  }
  return bVar1;
}

Assistant:

bool dev_ping::Impl::host_resolve(const std::string &hostname)
{
    // host resolve
    if (!getsockaddr(hostname.c_str(), &m_dest_addr)) {
        status.append("Ping:        Unknow host '" + hostname + "' !\n");
        deinit();
        return false;
    }

    status.append("Ping: hostname '" + hostname + "' (to ip: " + inet_ntoa(m_dest_addr.sin_addr) + /*", from self iface ip " + inet_ntoa(m_from_addr.sin_addr) +*/ ")\n");

    host_is_resolve = true;
    return true;
}